

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

uint32_t array_container_rank_many
                   (array_container_t *arr,uint64_t start_rank,uint32_t *begin,uint32_t *end,
                   uint64_t *ans)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t *puVar4;
  long lVar5;
  ulong uVar6;
  uint32_t *puVar7;
  
  uVar1 = *begin;
  uVar6 = 0;
  for (puVar7 = begin;
      (puVar4 = end, puVar7 != end && (puVar4 = puVar7, (*puVar7 ^ uVar1) < 0x10000));
      puVar7 = puVar7 + 1) {
    uVar3 = binarySearch(arr->array + uVar6,arr->cardinality - (int)uVar6,(uint16_t)*puVar7);
    lVar5 = uVar6 + start_rank;
    uVar2 = ~uVar3;
    if (-1 < (int)uVar3) {
      uVar2 = uVar3 + 1;
    }
    if (-1 < (int)uVar3) {
      uVar6 = (ulong)(uVar3 + 1);
    }
    *ans = (ulong)uVar2 + lVar5;
    ans = ans + 1;
  }
  return (uint32_t)((ulong)((long)puVar4 - (long)begin) >> 2);
}

Assistant:

inline uint32_t array_container_rank_many(const array_container_t *arr,
                                          uint64_t start_rank,
                                          const uint32_t *begin,
                                          const uint32_t *end, uint64_t *ans) {
    const uint16_t high = (uint16_t)((*begin) >> 16);
    uint32_t pos = 0;
    const uint32_t *iter = begin;
    for (; iter != end; iter++) {
        uint32_t x = *iter;
        uint16_t xhigh = (uint16_t)(x >> 16);
        if (xhigh != high) return iter - begin;  // stop at next container

        const int32_t idx =
            binarySearch(arr->array + pos, arr->cardinality - pos, (uint16_t)x);
        const bool is_present = idx >= 0;
        if (is_present) {
            *(ans++) = start_rank + pos + (idx + 1);
            pos = idx + 1;
        } else {
            *(ans++) = start_rank + pos + (-idx - 1);
        }
    }
    return iter - begin;
}